

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadlib.c
# Opt level: O0

int ll_require(lua_State *L)

{
  int iVar1;
  char *k;
  char *name;
  lua_State *L_local;
  
  k = luaL_checklstring(L,1,(size_t *)0x0);
  lua_settop(L,1);
  lua_getfield(L,-0xf4628,"_LOADED");
  lua_getfield(L,2,k);
  iVar1 = lua_toboolean(L,-1);
  if (iVar1 == 0) {
    lua_settop(L,-2);
    findloader(L,k);
    lua_rotate(L,-2,1);
    lua_pushvalue(L,1);
    lua_pushvalue(L,-3);
    lua_callk(L,2,1,0,(lua_KFunction)0x0);
    iVar1 = lua_type(L,-1);
    if (iVar1 == 0) {
      lua_settop(L,-2);
    }
    else {
      lua_setfield(L,2,k);
    }
    iVar1 = lua_getfield(L,2,k);
    if (iVar1 == 0) {
      lua_pushboolean(L,1);
      lua_copy(L,-1,-2);
      lua_setfield(L,2,k);
    }
    lua_rotate(L,-2,1);
    L_local._4_4_ = 2;
  }
  else {
    L_local._4_4_ = 1;
  }
  return L_local._4_4_;
}

Assistant:

static int ll_require (lua_State *L) {
  const char *name = luaL_checkstring(L, 1);
  lua_settop(L, 1);  /* LOADED table will be at index 2 */
  lua_getfield(L, LUA_REGISTRYINDEX, LUA_LOADED_TABLE);
  lua_getfield(L, 2, name);  /* LOADED[name] */
  if (lua_toboolean(L, -1))  /* is it there? */
    return 1;  /* package is already loaded */
  /* else must load package */
  lua_pop(L, 1);  /* remove 'getfield' result */
  findloader(L, name);
  lua_rotate(L, -2, 1);  /* function <-> loader data */
  lua_pushvalue(L, 1);  /* name is 1st argument to module loader */
  lua_pushvalue(L, -3);  /* loader data is 2nd argument */
  /* stack: ...; loader data; loader function; mod. name; loader data */
  lua_call(L, 2, 1);  /* run loader to load module */
  /* stack: ...; loader data; result from loader */
  if (!lua_isnil(L, -1))  /* non-nil return? */
    lua_setfield(L, 2, name);  /* LOADED[name] = returned value */
  else
    lua_pop(L, 1);  /* pop nil */
  if (lua_getfield(L, 2, name) == LUA_TNIL) {   /* module set no value? */
    lua_pushboolean(L, 1);  /* use true as result */
    lua_copy(L, -1, -2);  /* replace loader result */
    lua_setfield(L, 2, name);  /* LOADED[name] = true */
  }
  lua_rotate(L, -2, 1);  /* loader data <-> module result  */
  return 2;  /* return module result and loader data */
}